

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::detail::
       make_function_aux<int(HighFreqDataType::*)()const,boost::python::default_call_policies,boost::mpl::vector2<int,HighFreqDataType&>>
                 (first_type f,default_call_policies *p,vector2<int,_HighFreqDataType_&> *param_3)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  object_base in_RDI;
  caller<int_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<int,_HighFreqDataType_&>_>
  *in_stack_ffffffffffffff88;
  py_function *in_stack_ffffffffffffff90;
  caller<int_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<int,_HighFreqDataType_&>_>
  local_50;
  py_function local_40 [8];
  
  caller<int_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<int,_HighFreqDataType_&>_>
  ::caller(&local_50,in_RSI,in_RDX);
  objects::py_function::
  py_function<boost::python::detail::caller<int(HighFreqDataType::*)()const,boost::python::default_call_policies,boost::mpl::vector2<int,HighFreqDataType&>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  objects::function_object((objects *)in_RDI.m_ptr,local_40);
  objects::py_function::~py_function((py_function *)0x3a9dab);
  return (object)(object_base)in_RDI.m_ptr;
}

Assistant:

object make_function_aux(
      F f                               // An object that can be invoked by detail::invoke()
      , CallPolicies const& p           // CallPolicies to use in the invocation
      , Sig const&                      // An MPL sequence of argument types expected by F
      )
  {
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
      );
  }